

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

void __thiscall String::detach(String *this,usize copyLength,usize minCapacity)

{
  usize *puVar1;
  Data *pDVar2;
  Data *pDVar3;
  EVP_PKEY_CTX *src;
  
  pDVar2 = this->data;
  if ((pDVar2->ref == 1) && (minCapacity <= pDVar2->capacity)) {
    pDVar2->len = copyLength;
    pDVar2->str[copyLength] = '\0';
  }
  else {
    pDVar3 = (Data *)operator_new__((minCapacity | 3) + 0x21);
    pDVar3->str = (char *)(pDVar3 + 1);
    src = (EVP_PKEY_CTX *)pDVar2->len;
    if (src == (EVP_PKEY_CTX *)0x0) {
      *(undefined1 *)&pDVar3[1].str = 0;
      pDVar3->len = copyLength;
    }
    else {
      if (copyLength <= src) {
        src = (EVP_PKEY_CTX *)copyLength;
      }
      Memory::copy((Memory *)(pDVar3 + 1),(EVP_PKEY_CTX *)pDVar2->str,src);
      pDVar3->len = copyLength;
      pDVar3->str[copyLength] = '\0';
    }
    pDVar3->ref = 1;
    pDVar3->capacity = minCapacity | 3;
    if (this->data->ref != 0) {
      LOCK();
      puVar1 = &this->data->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
        operator_delete__(this->data);
      }
    }
    this->data = pDVar3;
  }
  return;
}

Assistant:

void detach(usize copyLength, usize minCapacity)
  {
#ifdef ASSERT
    ASSERT(copyLength <= minCapacity);
#endif
    if(data->ref == 1 && minCapacity <= data->capacity)
    {
      ((char*)data->str)[data->len = copyLength] = '\0';
      return;
    }

    usize capacity = minCapacity | 0x3;
    Data* newData = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    newData->str = (char*)((byte*)newData + sizeof(Data));
    if(data->len > 0)
    {
      Memory::copy((char*)newData->str, data->str, (data->len < copyLength ? data->len : copyLength) * sizeof(char));
      ((char*)newData->str)[newData->len = copyLength] = '\0';
    }
    else
    {
      *(char*)newData->str = '\0';
      newData->len = copyLength;
    }
    newData->ref = 1;
    newData->capacity = capacity;

    if(data->ref && Atomic::decrement(data->ref) == 0)
      delete[] (char*)data;

    data = newData;
  }